

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionInstruction
          (ValidationState_t *_,Instruction *inst,uint32_t version)

{
  bool bVar1;
  uint32_t id;
  DiagnosticStream *pDVar2;
  ValidationState_t *inst_00;
  string local_400;
  DiagnosticStream local_3e0;
  NonSemanticClspvReflectionInstructions local_208;
  uint local_204;
  NonSemanticClspvReflectionInstructions ext_inst;
  uint32_t required_version;
  uint32_t local_24;
  ValidationState_t *pVStack_20;
  uint32_t version_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_24 = version;
  pVStack_20 = (ValidationState_t *)inst;
  inst_local = (Instruction *)_;
  id = val::Instruction::type_id(inst);
  bVar1 = ValidationState_t::IsVoidType(_,id);
  if (bVar1) {
    local_204 = 0;
    local_208 = val::Instruction::GetOperandAs<NonSemanticClspvReflectionInstructions>
                          ((Instruction *)pVStack_20,3);
    switch(local_208) {
    case NonSemanticClspvReflectionKernel:
    case NonSemanticClspvReflectionArgumentInfo:
    case NonSemanticClspvReflectionArgumentStorageBuffer:
    case NonSemanticClspvReflectionArgumentUniform:
    case NonSemanticClspvReflectionArgumentPodStorageBuffer:
    case NonSemanticClspvReflectionArgumentPodUniform:
    case NonSemanticClspvReflectionArgumentPodPushConstant:
    case NonSemanticClspvReflectionArgumentSampledImage:
    case NonSemanticClspvReflectionArgumentStorageImage:
    case NonSemanticClspvReflectionArgumentSampler:
    case NonSemanticClspvReflectionArgumentWorkgroup:
    case NonSemanticClspvReflectionSpecConstantWorkgroupSize:
    case NonSemanticClspvReflectionSpecConstantGlobalOffset:
    case NonSemanticClspvReflectionSpecConstantWorkDim:
    case NonSemanticClspvReflectionPushConstantGlobalOffset:
    case NonSemanticClspvReflectionPushConstantEnqueuedLocalSize:
    case NonSemanticClspvReflectionPushConstantGlobalSize:
    case NonSemanticClspvReflectionPushConstantRegionOffset:
    case NonSemanticClspvReflectionPushConstantNumWorkgroups:
    case NonSemanticClspvReflectionPushConstantRegionGroupOffset:
    case NonSemanticClspvReflectionConstantDataStorageBuffer:
    case NonSemanticClspvReflectionConstantDataUniform:
    case NonSemanticClspvReflectionLiteralSampler:
    case NonSemanticClspvReflectionPropertyRequiredWorkgroupSize:
      local_204 = 1;
      break;
    case NonSemanticClspvReflectionSpecConstantSubgroupMaxSize:
      local_204 = 2;
      break;
    case NonSemanticClspvReflectionArgumentPointerPushConstant:
    case NonSemanticClspvReflectionArgumentPointerUniform:
    case NonSemanticClspvReflectionProgramScopeVariablesStorageBuffer:
    case NonSemanticClspvReflectionProgramScopeVariablePointerRelocation:
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderPushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypePushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderUniform:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypeUniform:
      local_204 = 3;
      break;
    case NonSemanticClspvReflectionArgumentStorageTexelBuffer:
    case NonSemanticClspvReflectionArgumentUniformTexelBuffer:
      local_204 = 4;
      break;
    case NonSemanticClspvReflectionConstantDataPointerPushConstant:
    case NonSemanticClspvReflectionProgramScopeVariablePointerPushConstant:
    case NonSemanticClspvReflectionPrintfInfo:
    case NonSemanticClspvReflectionPrintfBufferStorageBuffer:
    case NonSemanticClspvReflectionPrintfBufferPointerPushConstant:
      local_204 = 5;
    }
    if (local_24 < local_204) {
      inst_00 = pVStack_20;
      ValidationState_t::diag
                (&local_3e0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 (Instruction *)pVStack_20);
      (anonymous_namespace)::ReflectionInstructionName_abi_cxx11_
                (&local_400,(_anonymous_namespace_ *)inst_local,pVStack_20,(Instruction *)inst_00);
      pDVar2 = DiagnosticStream::operator<<(&local_3e0,&local_400);
      pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [19])" requires version ");
      pDVar2 = DiagnosticStream::operator<<(pDVar2,&local_204);
      pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [25])", but parsed version is ");
      pDVar2 = DiagnosticStream::operator<<(pDVar2,&local_24);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
      std::__cxx11::string::~string((string *)&local_400);
      DiagnosticStream::~DiagnosticStream(&local_3e0);
    }
    else {
      switch(local_208) {
      case NonSemanticClspvReflectionKernel:
        __local._4_4_ =
             ValidateClspvReflectionKernel
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20,local_24);
        break;
      case NonSemanticClspvReflectionArgumentInfo:
        __local._4_4_ =
             ValidateClspvReflectionArgumentInfo
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionArgumentStorageBuffer:
      case NonSemanticClspvReflectionArgumentUniform:
      case NonSemanticClspvReflectionArgumentSampledImage:
      case NonSemanticClspvReflectionArgumentStorageImage:
      case NonSemanticClspvReflectionArgumentSampler:
      case NonSemanticClspvReflectionArgumentStorageTexelBuffer:
      case NonSemanticClspvReflectionArgumentUniformTexelBuffer:
        __local._4_4_ =
             ValidateClspvReflectionArgumentBuffer
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionArgumentPodStorageBuffer:
      case NonSemanticClspvReflectionArgumentPodUniform:
      case NonSemanticClspvReflectionArgumentPointerUniform:
        __local._4_4_ =
             ValidateClspvReflectionArgumentOffsetBuffer
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionArgumentPodPushConstant:
      case NonSemanticClspvReflectionArgumentPointerPushConstant:
        __local._4_4_ =
             ValidateClspvReflectionArgumentPushConstant
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionArgumentWorkgroup:
        __local._4_4_ =
             ValidateClspvReflectionArgumentWorkgroup
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionSpecConstantWorkgroupSize:
      case NonSemanticClspvReflectionSpecConstantGlobalOffset:
        __local._4_4_ =
             ValidateClspvReflectionSpecConstantTriple
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionSpecConstantWorkDim:
        __local._4_4_ =
             ValidateClspvReflectionSpecConstantWorkDim
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionPushConstantGlobalOffset:
      case NonSemanticClspvReflectionPushConstantEnqueuedLocalSize:
      case NonSemanticClspvReflectionPushConstantGlobalSize:
      case NonSemanticClspvReflectionPushConstantRegionOffset:
      case NonSemanticClspvReflectionPushConstantNumWorkgroups:
      case NonSemanticClspvReflectionPushConstantRegionGroupOffset:
        __local._4_4_ =
             ValidateClspvReflectionPushConstant
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionConstantDataStorageBuffer:
      case NonSemanticClspvReflectionConstantDataUniform:
      case NonSemanticClspvReflectionProgramScopeVariablesStorageBuffer:
        __local._4_4_ =
             ValidateClspvReflectionInitializedData
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionLiteralSampler:
        __local._4_4_ =
             ValidateClspvReflectionSampler
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionPropertyRequiredWorkgroupSize:
        __local._4_4_ =
             ValidateClspvReflectionPropertyRequiredWorkgroupSize
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionSpecConstantSubgroupMaxSize:
        __local._4_4_ =
             ValidateClspvReflectionSubgroupMaxSize
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionProgramScopeVariablePointerRelocation:
        __local._4_4_ =
             ValidateClspvReflectionPointerRelocation
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionImageArgumentInfoChannelOrderPushConstant:
      case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypePushConstant:
        __local._4_4_ =
             ValidateClspvReflectionImageMetadataPushConstant
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionImageArgumentInfoChannelOrderUniform:
      case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypeUniform:
        __local._4_4_ =
             ValidateClspvReflectionImageMetadataUniform
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionConstantDataPointerPushConstant:
      case NonSemanticClspvReflectionProgramScopeVariablePointerPushConstant:
        __local._4_4_ =
             ValidateClspvReflectionPushConstantData
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionPrintfInfo:
        __local._4_4_ =
             ValidateClspvReflectionPrintfInfo
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionPrintfBufferStorageBuffer:
        __local._4_4_ =
             ValidateClspvReflectionPrintfStorageBuffer
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      case NonSemanticClspvReflectionPrintfBufferPointerPushConstant:
        __local._4_4_ =
             ValidateClspvReflectionPrintfPushConstant
                       ((ValidationState_t *)inst_local,(Instruction *)pVStack_20);
        break;
      default:
        __local._4_4_ = SPV_SUCCESS;
      }
    }
  }
  else {
    ValidationState_t::diag
              ((DiagnosticStream *)&ext_inst,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
               (Instruction *)pVStack_20);
    pDVar2 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&ext_inst,
                        (char (*) [31])"Return Type must be OpTypeVoid");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&ext_inst);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateClspvReflectionInstruction(ValidationState_t& _,
                                                const Instruction* inst,
                                                uint32_t version) {
  if (!_.IsVoidType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Return Type must be OpTypeVoid";
  }

  uint32_t required_version = 0;
  const auto ext_inst =
      inst->GetOperandAs<NonSemanticClspvReflectionInstructions>(3);
  switch (ext_inst) {
    case NonSemanticClspvReflectionKernel:
    case NonSemanticClspvReflectionArgumentInfo:
    case NonSemanticClspvReflectionArgumentStorageBuffer:
    case NonSemanticClspvReflectionArgumentUniform:
    case NonSemanticClspvReflectionArgumentPodStorageBuffer:
    case NonSemanticClspvReflectionArgumentPodUniform:
    case NonSemanticClspvReflectionArgumentPodPushConstant:
    case NonSemanticClspvReflectionArgumentSampledImage:
    case NonSemanticClspvReflectionArgumentStorageImage:
    case NonSemanticClspvReflectionArgumentSampler:
    case NonSemanticClspvReflectionArgumentWorkgroup:
    case NonSemanticClspvReflectionSpecConstantWorkgroupSize:
    case NonSemanticClspvReflectionSpecConstantGlobalOffset:
    case NonSemanticClspvReflectionSpecConstantWorkDim:
    case NonSemanticClspvReflectionPushConstantGlobalOffset:
    case NonSemanticClspvReflectionPushConstantEnqueuedLocalSize:
    case NonSemanticClspvReflectionPushConstantGlobalSize:
    case NonSemanticClspvReflectionPushConstantRegionOffset:
    case NonSemanticClspvReflectionPushConstantNumWorkgroups:
    case NonSemanticClspvReflectionPushConstantRegionGroupOffset:
    case NonSemanticClspvReflectionConstantDataStorageBuffer:
    case NonSemanticClspvReflectionConstantDataUniform:
    case NonSemanticClspvReflectionLiteralSampler:
    case NonSemanticClspvReflectionPropertyRequiredWorkgroupSize:
      required_version = 1;
      break;
    case NonSemanticClspvReflectionSpecConstantSubgroupMaxSize:
      required_version = 2;
      break;
    case NonSemanticClspvReflectionArgumentPointerPushConstant:
    case NonSemanticClspvReflectionArgumentPointerUniform:
    case NonSemanticClspvReflectionProgramScopeVariablesStorageBuffer:
    case NonSemanticClspvReflectionProgramScopeVariablePointerRelocation:
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderPushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypePushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderUniform:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypeUniform:
      required_version = 3;
      break;
    case NonSemanticClspvReflectionArgumentStorageTexelBuffer:
    case NonSemanticClspvReflectionArgumentUniformTexelBuffer:
      required_version = 4;
      break;
    case NonSemanticClspvReflectionConstantDataPointerPushConstant:
    case NonSemanticClspvReflectionProgramScopeVariablePointerPushConstant:
    case NonSemanticClspvReflectionPrintfInfo:
    case NonSemanticClspvReflectionPrintfBufferStorageBuffer:
    case NonSemanticClspvReflectionPrintfBufferPointerPushConstant:
      required_version = 5;
      break;
    default:
      break;
  }
  if (version < required_version) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << ReflectionInstructionName(_, inst) << " requires version "
           << required_version << ", but parsed version is " << version;
  }

  switch (ext_inst) {
    case NonSemanticClspvReflectionKernel:
      return ValidateClspvReflectionKernel(_, inst, version);
    case NonSemanticClspvReflectionArgumentInfo:
      return ValidateClspvReflectionArgumentInfo(_, inst);
    case NonSemanticClspvReflectionArgumentStorageBuffer:
    case NonSemanticClspvReflectionArgumentUniform:
    case NonSemanticClspvReflectionArgumentSampledImage:
    case NonSemanticClspvReflectionArgumentStorageImage:
    case NonSemanticClspvReflectionArgumentSampler:
    case NonSemanticClspvReflectionArgumentStorageTexelBuffer:
    case NonSemanticClspvReflectionArgumentUniformTexelBuffer:
      return ValidateClspvReflectionArgumentBuffer(_, inst);
    case NonSemanticClspvReflectionArgumentPodStorageBuffer:
    case NonSemanticClspvReflectionArgumentPodUniform:
    case NonSemanticClspvReflectionArgumentPointerUniform:
      return ValidateClspvReflectionArgumentOffsetBuffer(_, inst);
    case NonSemanticClspvReflectionArgumentPodPushConstant:
    case NonSemanticClspvReflectionArgumentPointerPushConstant:
      return ValidateClspvReflectionArgumentPushConstant(_, inst);
    case NonSemanticClspvReflectionArgumentWorkgroup:
      return ValidateClspvReflectionArgumentWorkgroup(_, inst);
    case NonSemanticClspvReflectionSpecConstantWorkgroupSize:
    case NonSemanticClspvReflectionSpecConstantGlobalOffset:
      return ValidateClspvReflectionSpecConstantTriple(_, inst);
    case NonSemanticClspvReflectionSpecConstantWorkDim:
      return ValidateClspvReflectionSpecConstantWorkDim(_, inst);
    case NonSemanticClspvReflectionPushConstantGlobalOffset:
    case NonSemanticClspvReflectionPushConstantEnqueuedLocalSize:
    case NonSemanticClspvReflectionPushConstantGlobalSize:
    case NonSemanticClspvReflectionPushConstantRegionOffset:
    case NonSemanticClspvReflectionPushConstantNumWorkgroups:
    case NonSemanticClspvReflectionPushConstantRegionGroupOffset:
      return ValidateClspvReflectionPushConstant(_, inst);
    case NonSemanticClspvReflectionConstantDataStorageBuffer:
    case NonSemanticClspvReflectionConstantDataUniform:
    case NonSemanticClspvReflectionProgramScopeVariablesStorageBuffer:
      return ValidateClspvReflectionInitializedData(_, inst);
    case NonSemanticClspvReflectionLiteralSampler:
      return ValidateClspvReflectionSampler(_, inst);
    case NonSemanticClspvReflectionPropertyRequiredWorkgroupSize:
      return ValidateClspvReflectionPropertyRequiredWorkgroupSize(_, inst);
    case NonSemanticClspvReflectionSpecConstantSubgroupMaxSize:
      return ValidateClspvReflectionSubgroupMaxSize(_, inst);
    case NonSemanticClspvReflectionProgramScopeVariablePointerRelocation:
      return ValidateClspvReflectionPointerRelocation(_, inst);
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderPushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypePushConstant:
      return ValidateClspvReflectionImageMetadataPushConstant(_, inst);
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderUniform:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypeUniform:
      return ValidateClspvReflectionImageMetadataUniform(_, inst);
    case NonSemanticClspvReflectionConstantDataPointerPushConstant:
    case NonSemanticClspvReflectionProgramScopeVariablePointerPushConstant:
      return ValidateClspvReflectionPushConstantData(_, inst);
    case NonSemanticClspvReflectionPrintfInfo:
      return ValidateClspvReflectionPrintfInfo(_, inst);
    case NonSemanticClspvReflectionPrintfBufferStorageBuffer:
      return ValidateClspvReflectionPrintfStorageBuffer(_, inst);
    case NonSemanticClspvReflectionPrintfBufferPointerPushConstant:
      return ValidateClspvReflectionPrintfPushConstant(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}